

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_strategy.cpp
# Opt level: O3

FUNCTION_RETURN __thiscall
license::hw_identifier::DefaultStrategy::generate_pc_id(DefaultStrategy *this,HwIdentifier *pc_id)

{
  LCC_API_HW_IDENTIFICATION_STRATEGY *pLVar1;
  FUNCTION_RETURN FVar2;
  LCC_API_HW_IDENTIFICATION_STRATEGY *pLVar3;
  pointer *__ptr;
  vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
  strategy_to_try;
  IdentificationStrategy local_48;
  LCC_API_HW_IDENTIFICATION_STRATEGY *local_40;
  LCC_API_HW_IDENTIFICATION_STRATEGY *local_38;
  
  available_strategies();
  pLVar1 = local_40;
  if (local_40 == local_38) {
    FVar2 = FUNC_RET_NOT_AVAIL;
  }
  else {
    do {
      pLVar3 = pLVar1 + 1;
      IdentificationStrategy::get_strategy(&local_48,*pLVar1);
      FVar2 = (**(code **)(*local_48._vptr_IdentificationStrategy + 0x18))
                        (local_48._vptr_IdentificationStrategy,pc_id);
      if (local_48._vptr_IdentificationStrategy != (_func_int **)0x0) {
        (**(code **)(*local_48._vptr_IdentificationStrategy + 8))();
      }
    } while ((FVar2 != FUNC_RET_OK) && (pLVar1 = pLVar3, pLVar3 != local_38));
  }
  if (local_40 != (LCC_API_HW_IDENTIFICATION_STRATEGY *)0x0) {
    operator_delete(local_40);
  }
  return FVar2;
}

Assistant:

FUNCTION_RETURN DefaultStrategy::generate_pc_id(HwIdentifier& pc_id) const {
	vector<LCC_API_HW_IDENTIFICATION_STRATEGY> strategy_to_try = available_strategies();
	FUNCTION_RETURN ret = FUNC_RET_NOT_AVAIL;
	for (auto it : strategy_to_try) {
		LCC_API_HW_IDENTIFICATION_STRATEGY strat_to_try = it;
		unique_ptr<IdentificationStrategy> strategy_ptr = IdentificationStrategy::get_strategy(strat_to_try);
		ret = strategy_ptr->generate_pc_id(pc_id);
		if (ret == FUNC_RET_OK) {
			break;
		}
	}
	return ret;
}